

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

string * deqp::gles2::Performance::strWithWhiteSpaceAndComments
                   (string *__return_storage_ptr__,string *str,deUint32 uniqueNumber)

{
  deUint32 dVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  deUint32 uniqueNumber_local;
  long local_b0;
  string *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Random rnd;
  
  uniqueNumber_local = uniqueNumber;
  local_a8 = str;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_a0);
  lVar5 = 0;
  local_b0 = 0x100000000;
  while( true ) {
    cVar3 = (char)__return_storage_ptr__;
    if (((int)local_a8->_M_string_length <= lVar5) || ((local_a8->_M_dataplus)._M_p[lVar5] == '\n'))
    break;
    std::__cxx11::string::push_back(cVar3);
    lVar5 = lVar5 + 1;
    local_b0 = local_b0 + 0x100000000;
  }
  std::__cxx11::string::push_back(cVar3);
  deRandom_init(&rnd.m_rnd,uniqueNumber_local);
  dVar1 = deRandom_getUint32(&rnd.m_rnd);
  iVar4 = dVar1 % 0xb + 10;
  iVar2 = iVar4;
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    deRandom_getUint32(&rnd.m_rnd);
    std::__cxx11::string::push_back(cVar3);
  }
  de::toString<unsigned_int>(&local_80,&uniqueNumber_local);
  std::operator+(&local_60,"/* unique comment ",&local_80);
  std::operator+(&local_a0,&local_60," */\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  de::toString<unsigned_int>(&local_80,&uniqueNumber_local);
  std::operator+(&local_60,"// unique comment ",&local_80);
  std::operator+(&local_a0,&local_60,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    deRandom_getUint32(&rnd.m_rnd);
    std::__cxx11::string::push_back(cVar3);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string strWithWhiteSpaceAndComments (const string& str, deUint32 uniqueNumber)
{
	string res("");

	// Find the first newline.
	int firstLineEndNdx = 0;
	while (firstLineEndNdx < (int)str.size() && str[firstLineEndNdx] != '\n')
	{
		res += str[firstLineEndNdx];
		firstLineEndNdx++;
	}
	res += '\n';
	DE_ASSERT(firstLineEndNdx < (int)str.size());

	// Add the whitespaces and comments just after the first line.

	de::Random		rnd		(uniqueNumber);
	int				numWS	= rnd.getInt(10, 20);

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	res += "/* unique comment " + de::toString(uniqueNumber) + " */\n";
	res += "// unique comment " + de::toString(uniqueNumber) + "\n";

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	// Add the rest of the string.
	res.append(&str.c_str()[firstLineEndNdx + 1]);

	return res;
}